

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::BasicNonMS<tcu::Vector<int,_4>,_5>::Run
          (BasicNonMS<tcu::Vector<int,_4>,_5> *this)

{
  GLuint GVar1;
  bool bVar2;
  GLenum GVar3;
  GLenum GVar4;
  reference data_00;
  undefined1 local_128 [8];
  ivec4 res [7];
  undefined1 local_b0 [8];
  ImageSizeMachine machine;
  allocator<unsigned_char> local_59;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int i;
  GLenum target [7];
  BasicNonMS<tcu::Vector<int,_4>,_5> *this_local;
  
  unique0x10000c1a = this;
  bVar2 = ShaderImageSizeBase::SupportedInStage(&this->super_ShaderImageSizeBase,5,8);
  if (bVar2) {
    target[0] = 0x8513;
    target[1] = 0x9009;
    target[2] = 0x84f5;
    target[3] = 0x8c1a;
    target[4] = 0x8c2a;
    for (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < 7;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,
                 target[(long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -2],
                 this->m_texture
                 [data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_]);
      if (target[(long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -2] != 0x8c2a) {
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,
                   target[(long)data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -2],0x2801
                   ,0x2600);
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,
                   target[(long)data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -2],0x2800
                   ,0x2600);
      }
      if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexStorage2D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,10,GVar3,0x200,0x80);
        GVar1 = this->m_texture
                [data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,GVar1,1,'\0',0,35000,GVar3);
      }
      else if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexStorage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x806f,3,GVar3,8,8,4);
        GVar1 = this->m_texture
                [data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,2,GVar1,0,'\x01',0,35000,GVar3);
      }
      else if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ == 2) {
        GVar3 = target[0];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexStorage2D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,4,GVar4,0x10,0x10);
        GVar1 = this->m_texture
                [data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,3,GVar1,0,'\0',0,0x88ba,GVar3);
      }
      else if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ == 3) {
        GVar3 = target[1];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexStorage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,2,GVar4,4,4,0xc);
        GVar1 = this->m_texture
                [data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,4,GVar1,1,'\x01',0,35000,GVar3);
      }
      else if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ == 4) {
        GVar3 = target[2];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexStorage2D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,1,GVar4,0x10,8);
        GVar1 = this->m_texture
                [data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,GVar1,0,'\0',0,35000,GVar3);
      }
      else if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ == 5) {
        GVar3 = target[3];
        GVar4 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexStorage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,3,GVar4,0x7f,0x27,0xc);
        GVar1 = this->m_texture
                [data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,6,GVar1,2,'\x01',0,35000,GVar3);
      }
      else if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ == 6) {
        std::allocator<unsigned_char>::allocator(&local_59);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0x100,&local_59
                  );
        std::allocator<unsigned_char>::~allocator(&local_59);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c2a,this->m_buffer);
        data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c2a,0x100,data_00,0x88e4);
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexBuffer
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c2a,GVar3,this->m_buffer);
        GVar1 = this->m_texture
                [data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_];
        GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,7,GVar1,0,'\0',0,35000,GVar3);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
      }
    }
    ImageSizeMachine::ImageSizeMachine((ImageSizeMachine *)local_b0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_128,0x100,0x40,0,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[0].m_data + 2),8,8,4,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[1].m_data + 2),0x10,0x10,0,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[2].m_data + 2),2,2,2,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[3].m_data + 2),0x10,8,0,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[4].m_data + 2),0x1f,9,0xc,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[5].m_data + 2),0x10,0,0,0);
    this_local = (BasicNonMS<tcu::Vector<int,_4>,_5> *)
                 gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<int,4>>
                           ((ImageSizeMachine *)local_b0,5,false,(ivec4 *)local_128,false);
    ImageSizeMachine::~ImageSizeMachine((ImageSizeMachine *)local_b0);
  }
  else {
    this_local = (BasicNonMS<tcu::Vector<int,_4>,_5> *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 8))
			return NOT_SUPPORTED;

		const GLenum target[7] = { GL_TEXTURE_2D,		 GL_TEXTURE_3D,
								   GL_TEXTURE_CUBE_MAP,  GL_TEXTURE_CUBE_MAP_ARRAY,
								   GL_TEXTURE_RECTANGLE, GL_TEXTURE_2D_ARRAY,
								   GL_TEXTURE_BUFFER };
		for (int i = 0; i < 7; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] != GL_TEXTURE_BUFFER)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexStorage2D(target[i], 10, TexInternalFormat<T>(), 512, 128);
				glBindImageTexture(1, m_texture[i], 1, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 8, 8, 4);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexStorage2D(target[i], 4, TexInternalFormat<T>(), 16, 16);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexStorage3D(target[i], 2, TexInternalFormat<T>(), 4, 4, 12);
				glBindImageTexture(4, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 4)
			{
				glTexStorage2D(target[i], 1, TexInternalFormat<T>(), 16, 8);
				glBindImageTexture(5, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 5)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 127, 39, 12);
				glBindImageTexture(6, m_texture[i], 2, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 6)
			{
				std::vector<GLubyte> data(256);
				glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
				glBufferData(GL_TEXTURE_BUFFER, 256, &data[0], GL_STATIC_DRAW);
				glTexBuffer(GL_TEXTURE_BUFFER, TexInternalFormat<T>(), m_buffer);
				glBindImageTexture(7, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[7] = { ivec4(256, 64, 0, 0), ivec4(8, 8, 4, 0),   ivec4(16, 16, 0, 0), ivec4(2, 2, 2, 0),
						 ivec4(16, 8, 0, 0),   ivec4(31, 9, 12, 0), ivec4(16, 0, 0, 0) };
		return machine.Run<T>(STAGE, false, res);
	}